

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O1

int run_with_handle(function<int_(_qpdfjob_handle_*)> *fn)

{
  int iVar1;
  qpdfjob_handle j_00;
  qpdfjob_handle j;
  qpdfjob_handle local_28;
  qpdfjob_handle local_20;
  
  j_00 = qpdfjob_init();
  local_28 = j_00;
  local_20 = j_00;
  if ((fn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    iVar1 = (*fn->_M_invoker)((_Any_data *)fn,&local_20);
    if (iVar1 == 0) {
      iVar1 = qpdfjob_run(j_00);
    }
    qpdfjob_cleanup(&local_28);
    return iVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

static int
run_with_handle(std::function<int(qpdfjob_handle)> fn)
{
    auto j = qpdfjob_init();
    int status = fn(j);
    if (status == 0) {
        status = qpdfjob_run(j);
    }
    qpdfjob_cleanup(&j);
    return status;
}